

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O3

void __thiscall
sisl::utility::isosurface::processFaces
          (isosurface *this,
          map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          *vMap,vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                *faces)

{
  int iVar1;
  mapped_type mVar2;
  mapped_type mVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  pointer ptVar6;
  _Rb_tree_header *p_Var7;
  int vIndex;
  vertex3 v;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> faceMap;
  _Tuple_impl<1UL,_int,_int> local_98;
  int local_90 [2];
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *local_88;
  undefined1 local_80 [8];
  _Head_base<0UL,_int,_false> local_78;
  double *local_70;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (vMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(vMap->_M_t)._M_impl.super__Rb_tree_header;
  local_88 = faces;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var5 != p_Var7) {
    do {
      vertex3::vertex3((vertex3 *)local_80,(vertex3 *)&p_Var5[1]._M_parent);
      local_98.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)p_Var5[1]._M_color;
      std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::push_back
                (&(this->plyfile).verts,(vertex3 *)local_80);
      iVar1 = (this->plyfile).m_currentIndex;
      (this->plyfile).m_currentIndex = iVar1 + 1;
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,(key_type *)&local_98);
      *pmVar4 = iVar1;
      free(local_70);
      free((void *)CONCAT44(local_80._4_4_,local_80._0_4_));
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var7);
  }
  ptVar6 = (local_88->
           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ptVar6 != (local_88->
                super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_90[0] = (ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).
                    super__Head_base<0UL,_int,_false>._M_head_impl;
      local_98 = (ptVar6->super__Tuple_impl<0UL,_int,_int,_int>).super__Tuple_impl<1UL,_int,_int>;
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,local_90);
      mVar2 = *pmVar4;
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,&local_98.super__Head_base<1UL,_int,_false>._M_head_impl);
      mVar3 = *pmVar4;
      pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_60,(key_type *)&local_98);
      local_80._0_4_ = *pmVar4;
      local_80._4_4_ = mVar3;
      local_78._M_head_impl = mVar2;
      std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>::
      emplace_back<std::tuple<int,int,int>>
                ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>> *)
                 &(this->plyfile).faces,(tuple<int,_int,_int> *)local_80);
      ptVar6 = ptVar6 + 1;
    } while (ptVar6 != (local_88->
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void processFaces(
            std::map<int, sisl::vertex3 > *vMap,
            const std::vector<std::tuple<int,int,int>> &faces){
         std::map<int, int> faceMap;

        for(auto itr = vMap->begin(); itr != vMap->end(); ++itr) {
            sisl::vertex3 v = itr->second;
            int vIndex = itr->first;

            faceMap[vIndex] = plyfile.add_vertex(v);
        }

        for(auto itr = faces.begin(); itr != faces.end(); ++itr) {
            std::tuple<int, int, int> t = *itr;

            int i1 = faceMap[std::get<0>(t)];
            int i2 = faceMap[std::get<1>(t)];
            int i3 = faceMap[std::get<2>(t)];

            plyfile.add_triangle(i1,i2,i3);
        }
    }